

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

bool __thiscall Js::FunctionBody::HasValidSourceInfo(FunctionBody *this)

{
  BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  SourceContextInfo *pSVar1;
  BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type local_28;
  SourceContextInfo *local_20;
  SourceContextInfo *sourceContextInfo;
  
  this_00 = (((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
              super_ScriptContextBase).javascriptLibrary)->cache).sourceContextInfoMap.ptr;
  if (this_00 ==
      (BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *)0x0) {
LAB_0076ff4a:
    pSVar1 = (((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
               m_srcInfo).ptr)->sourceContextInfo).ptr;
    if ((pSVar1->dwHostSourceContext != 0xffffffffffffffff) &&
       ((pSVar1->isHostDynamicDocument & 1U) == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xe41,"(this->IsDynamicScript())","this->IsDynamicScript()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    this_01 = (((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                super_ScriptContextBase).javascriptLibrary)->cache).dynamicSourceContextInfoMap.ptr;
    if (this_01 !=
        (BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0) {
      bVar3 = JsUtil::
              BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::TryGetValue<unsigned_int>
                        (this_01,&(((((((this->super_ParseableFunctionInfo).super_FunctionProxy.
                                        m_utf8SourceInfo.ptr)->m_srcInfo).ptr)->sourceContextInfo).
                                   ptr)->field_5).hash,&local_20);
      if ((bVar3) &&
         (local_20 ==
          (((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
            m_srcInfo).ptr)->sourceContextInfo).ptr)) goto LAB_0077001b;
    }
    pSVar1 = (((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
               m_srcInfo).ptr)->sourceContextInfo).ptr;
    bVar3 = true;
    if (pSVar1->isHostDynamicDocument == false) {
      bVar3 = (((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                super_ScriptContextBase).javascriptLibrary)->cache).noContextSourceContextInfo.ptr
              == pSVar1;
    }
  }
  else {
    local_28 = ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
                  m_srcInfo).ptr)->sourceContextInfo).ptr)->dwHostSourceContext;
    bVar3 = JsUtil::
            BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<unsigned_long>(this_00,&local_28,&local_20);
    if ((!bVar3) ||
       (local_20 !=
        (((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->m_srcInfo
          ).ptr)->sourceContextInfo).ptr)) goto LAB_0076ff4a;
LAB_0077001b:
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool FunctionBody::HasValidSourceInfo()
    {
        SourceContextInfo* sourceContextInfo;

        if (m_scriptContext->GetSourceContextInfoMap())
        {
            if(m_scriptContext->GetSourceContextInfoMap()->TryGetValue(this->GetHostSourceContext(), &sourceContextInfo) &&
                sourceContextInfo == this->GetSourceContextInfo())
            {
                return true;
            }
        }
        Assert(this->IsDynamicScript());

        if(m_scriptContext->GetDynamicSourceContextInfoMap())
        {
            if(m_scriptContext->GetDynamicSourceContextInfoMap()->TryGetValue(this->GetSourceContextInfo()->hash, &sourceContextInfo) &&
                sourceContextInfo == this->GetSourceContextInfo())
            {
                return true;
            }
        }

        // The SourceContextInfo will not be added to the dynamicSourceContextInfoMap, if they are host provided dynamic code. But they are valid source context info
        if (this->GetSourceContextInfo()->isHostDynamicDocument)
        {
            return true;
        }
        return m_scriptContext->IsNoContextSourceContextInfo(this->GetSourceContextInfo());
    }